

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O3

Fraig_Node_t * Fraig_NodeCreateConst(Fraig_Man_t *p)

{
  int iVar1;
  Fraig_NodeVec_t *p_00;
  Fraig_Node_t *Entry;
  uint *__s;
  
  Entry = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmNodes);
  memset(Entry,0,0xa0);
  p_00 = p->vNodes;
  Entry->Num = p_00->nSize;
  Fraig_NodeVecPush(p_00,Entry);
  Entry->NumPi = -1;
  Entry->Level = 0;
  Entry->nRefs = 1;
  Entry->field_0x18 = Entry->field_0x18 | 1;
  __s = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  Entry->puSimR = __s;
  iVar1 = p->nWordsRand;
  Entry->puSimD = __s + iVar1;
  memset(__s,0,(long)iVar1 << 2);
  memset(Entry->puSimD,0,(long)p->nWordsDyna << 2);
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfff | p->nWordsRand << 0x11;
  Fraig_HashTableLookupF0(p,Entry);
  return Entry;
}

Assistant:

Fraig_Node_t * Fraig_NodeCreateConst( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode;

    // create the node
    pNode = (Fraig_Node_t *)Fraig_MemFixedEntryFetch( p->mmNodes );
    memset( pNode, 0, sizeof(Fraig_Node_t) );

    // assign the number and add to the array of nodes
    pNode->Num   = p->vNodes->nSize;
    Fraig_NodeVecPush( p->vNodes,  pNode );
    pNode->NumPi = -1;  // this is not a PI, so its number is -1
    pNode->Level =  0;  // just like a PI, it has 0 level
    pNode->nRefs =  1;  // it is a persistent node, which comes referenced
    pNode->fInv  =  1;  // the simulation info is complemented

    // create the simulation info
    pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    pNode->puSimD = pNode->puSimR + p->nWordsRand;
    memset( pNode->puSimR, 0, sizeof(unsigned) * p->nWordsRand );
    memset( pNode->puSimD, 0, sizeof(unsigned) * p->nWordsDyna );

    // count the number of ones in the simulation vector
    pNode->nOnes = p->nWordsRand * sizeof(unsigned) * 8;

    // insert it into the hash table
    Fraig_HashTableLookupF0( p, pNode );
    return pNode;
}